

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

size_t __thiscall
kj::BufferedInputStreamWrapper::tryRead
          (BufferedInputStreamWrapper *this,ArrayPtr<unsigned_char> dst,size_t minBytes)

{
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  uchar *puVar4;
  size_t sVar5;
  ulong uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ArrayPtr<const_unsigned_char> AVar7;
  ArrayPtr<unsigned_char> local_b0;
  uchar *local_a0;
  size_t local_98;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> local_90;
  size_t fromSecondBuffer;
  size_t local_80;
  size_t local_78;
  size_t n_1;
  uchar *local_68;
  size_t local_60;
  size_t fromFirstBuffer;
  size_t local_50;
  size_t local_48;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long_&>_> local_40;
  size_t n;
  size_t maxBytes;
  size_t minBytes_local;
  BufferedInputStreamWrapper *this_local;
  ArrayPtr<unsigned_char> dst_local;
  
  dst_local.ptr = (uchar *)dst.size_;
  this_local = (BufferedInputStreamWrapper *)dst.ptr;
  maxBytes = minBytes;
  minBytes_local = (size_t)this;
  n = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
  sVar5 = maxBytes;
  sVar2 = ArrayPtr<const_unsigned_char>::size(&this->bufferAvailable);
  if (sVar2 < sVar5) {
    puVar3 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
    puVar4 = ArrayPtr<const_unsigned_char>::begin(&this->bufferAvailable);
    sVar5 = ArrayPtr<const_unsigned_char>::size(&this->bufferAvailable);
    memcpy(puVar3,puVar4,sVar5);
    local_60 = ArrayPtr<const_unsigned_char>::size(&this->bufferAvailable);
    _n_1 = ArrayPtr<unsigned_char>::slice((ArrayPtr<unsigned_char> *)&this_local,local_60);
    this_local = (BufferedInputStreamWrapper *)n_1;
    dst_local.ptr = local_68;
    maxBytes = maxBytes - local_60;
    uVar6 = n - local_60;
    n = uVar6;
    sVar5 = ArrayPtr<unsigned_char>::size(&this->buffer);
    if (sVar5 < uVar6) {
      ArrayPtr<const_unsigned_char>::operator=(&this->bufferAvailable,(void *)0x0);
      sVar5 = local_60;
      iVar1 = (*this->inner->_vptr_InputStream[2])(this->inner,this_local,dst_local.ptr,maxBytes);
      dst_local.size_ = sVar5 + CONCAT44(extraout_var_00,iVar1);
    }
    else {
      fromSecondBuffer = (size_t)(this->buffer).ptr;
      local_80 = (this->buffer).size_;
      iVar1 = (*this->inner->_vptr_InputStream[2])(this->inner,fromSecondBuffer,local_80,maxBytes);
      local_78 = CONCAT44(extraout_var,iVar1);
      local_90 = min<unsigned_long&,unsigned_long&>(&local_78,&n);
      puVar3 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
      puVar4 = ArrayPtr<unsigned_char>::begin(&this->buffer);
      memcpy(puVar3,puVar4,local_90);
      local_b0 = ArrayPtr<unsigned_char>::slice(&this->buffer,local_90,local_78);
      AVar7 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_b0);
      local_a0 = AVar7.ptr;
      (this->bufferAvailable).ptr = local_a0;
      local_98 = AVar7.size_;
      (this->bufferAvailable).size_ = local_98;
      dst_local.size_ = local_60 + local_90;
    }
  }
  else {
    local_48 = ArrayPtr<const_unsigned_char>::size(&this->bufferAvailable);
    local_40 = min<unsigned_long,unsigned_long&>(&local_48,&n);
    puVar3 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
    puVar4 = ArrayPtr<const_unsigned_char>::begin(&this->bufferAvailable);
    memcpy(puVar3,puVar4,local_40);
    AVar7 = ArrayPtr<const_unsigned_char>::slice(&this->bufferAvailable,local_40);
    fromFirstBuffer = (size_t)AVar7.ptr;
    (this->bufferAvailable).ptr = (uchar *)fromFirstBuffer;
    local_50 = AVar7.size_;
    (this->bufferAvailable).size_ = local_50;
    dst_local.size_ = local_40;
  }
  return dst_local.size_;
}

Assistant:

size_t BufferedInputStreamWrapper::tryRead(ArrayPtr<byte> dst, size_t minBytes) {
  size_t maxBytes = dst.size();
  if (minBytes <= bufferAvailable.size()) {
    // Serve from current buffer.
    size_t n = kj::min(bufferAvailable.size(), maxBytes);
    memcpy(dst.begin(), bufferAvailable.begin(), n);
    bufferAvailable = bufferAvailable.slice(n);
    return n;
  } else {
    // Copy current available into destination.
    memcpy(dst.begin(), bufferAvailable.begin(), bufferAvailable.size());
    size_t fromFirstBuffer = bufferAvailable.size();
    dst = dst.slice(fromFirstBuffer);
    minBytes -= fromFirstBuffer;
    maxBytes -= fromFirstBuffer;

    if (maxBytes <= buffer.size()) {
      // Read the next buffer-full.
      size_t n = inner.tryRead(buffer, minBytes);
      size_t fromSecondBuffer = kj::min(n, maxBytes);
      memcpy(dst.begin(), buffer.begin(), fromSecondBuffer);
      bufferAvailable = buffer.slice(fromSecondBuffer, n);
      return fromFirstBuffer + fromSecondBuffer;
    } else {
      // Forward large read to the underlying stream.
      bufferAvailable = nullptr;
      return fromFirstBuffer + inner.tryRead(dst, minBytes);
    }
  }
}